

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O1

void buildDoGPyramid(vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                     *scaleSpace,
                    vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                    *dogScaleSpace)

{
  long lVar1;
  long lVar2;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tmpDogScale;
  Mat tmp;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_208;
  Mat local_1f0;
  long *local_190 [2];
  Mat local_180;
  Mat local_120;
  Mat local_c0;
  
  lVar1 = 0;
  do {
    local_208.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_208.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_208.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lVar2 = 0;
    do {
      cv::operator-((Mat *)local_190,
                    (Mat *)(*(long *)&(scaleSpace->
                                      super__Vector_base<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar1].
                                      super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                                      super__Vector_impl_data + lVar2 + 0x60));
      cv::Mat::Mat(&local_1f0);
      (**(code **)(*local_190[0] + 0x18))(local_190[0],(Mat *)local_190,&local_1f0,0xffffffff);
      cv::Mat::~Mat(&local_c0);
      cv::Mat::~Mat(&local_120);
      cv::Mat::~Mat(&local_180);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back(&local_208,&local_1f0);
      cv::Mat::~Mat(&local_1f0);
      lVar2 = lVar2 + 0x60;
    } while (lVar2 != 0x180);
    std::
    vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
    ::push_back(dogScaleSpace,&local_208);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_208);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

void buildDoGPyramid(const vector<vector<Mat> >& scaleSpace, vector<vector<Mat> >& dogScaleSpace){
    for(int i=0; i<octave; i++){
        vector<Mat> tmpDogScale;
        for(int j=0; j<octaveLayer-1; j++){
            Mat tmp = scaleSpace[i][j+1] - scaleSpace[i][j];
            // sharpen2(tmp,tmp);
            tmpDogScale.push_back(tmp);
        }
        dogScaleSpace.push_back(tmpDogScale);
    }
}